

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O0

bool __thiscall
SBPL2DGridSearch::search_withbuckets
          (SBPL2DGridSearch *this,uchar **Grid2D,uchar obsthresh,int startx_c,int starty_c,
          int goalx_c,int goaly_c)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int x;
  int y;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  int in_ECX;
  byte in_DL;
  uchar **in_RSI;
  SBPL2DGridSearch *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int oldstatepriority;
  int cost;
  int mapcost;
  int newy;
  int newx;
  int dir;
  int exp_y;
  int exp_x;
  CBucket OPEN2DBLIST;
  int max_bucketed_priority;
  clock_t starttime;
  int numofExpands;
  SBPL_2DGridSearchState *searchPredState;
  SBPL_2DGridSearchState *searchExpState;
  char *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  CBucket *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  uint uVar8;
  undefined2 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff12;
  byte in_stack_ffffffffffffff13;
  uint in_stack_ffffffffffffff14;
  byte local_e2;
  int local_cc;
  uint local_b0;
  int local_a4;
  CBucket local_88;
  int local_4c;
  clock_t local_48;
  int local_3c;
  SBPL_2DGridSearchState *local_38;
  SBPL_2DGridSearchState *local_30;
  int local_28;
  int local_24;
  int local_20;
  byte local_19;
  uchar **local_18;
  byte local_1;
  
  local_30 = (SBPL_2DGridSearchState *)0x0;
  local_38 = (SBPL_2DGridSearchState *)0x0;
  local_3c = 0;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_19 = in_DL;
  local_18 = in_RSI;
  local_48 = clock();
  if (in_RDI->height_ < in_RDI->width_) {
    local_cc = in_RDI->width_;
  }
  else {
    local_cc = in_RDI->height_;
  }
  local_4c = (int)((double)local_19 * 0.1 * (double)in_RDI->dxy_distance_mm_[0] * (double)local_cc);
  CBucket::CBucket((CBucket *)
                   CONCAT44(in_stack_ffffffffffffff14,
                            CONCAT13(in_stack_ffffffffffffff13,
                                     CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10)))
                   ,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  in_RDI->iteration_ = in_RDI->iteration_ + 1;
  in_RDI->startX_ = local_20;
  in_RDI->startY_ = local_24;
  in_RDI->goalX_ = local_28;
  in_RDI->goalY_ = in_stack_00000008;
  bVar2 = withinMap(in_RDI,local_20,local_24);
  if ((bVar2) && (bVar2 = withinMap(in_RDI,local_28,in_stack_00000008), bVar2)) {
    local_30 = in_RDI->searchStates2D_[in_RDI->startX_] + in_RDI->startY_;
    initializeSearchState2D(in_RDI,local_30);
    local_30->g = 0;
    (local_30->super_AbstractSearchState).heapindex = -1;
    CBucket::insert((CBucket *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    (AbstractSearchState *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    while (bVar2 = CBucket::empty(&local_88), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_30 = (SBPL_2DGridSearchState *)CBucket::popminelement(in_stack_fffffffffffffef8);
      local_3c = local_3c + 1;
      iVar6 = local_30->x;
      iVar1 = local_30->y;
      for (local_a4 = 0; local_a4 < 0x10; local_a4 = local_a4 + 1) {
        x = iVar6 + in_RDI->dx_[local_a4];
        y = iVar1 + in_RDI->dy_[local_a4];
        bVar2 = withinMap(in_RDI,x,y);
        if (bVar2) {
          bVar3 = (*in_RDI->getCost)(local_18,x,y,in_RDI->downsample_);
          bVar4 = (*in_RDI->getCost)(local_18,iVar6,iVar1,in_RDI->downsample_);
          if (bVar4 < bVar3) {
            local_e2 = (*in_RDI->getCost)(local_18,x,y,in_RDI->downsample_);
          }
          else {
            local_e2 = (*in_RDI->getCost)(local_18,iVar6,iVar1,in_RDI->downsample_);
          }
          local_b0 = (uint)local_e2;
          if (7 < local_a4) {
            bVar3 = (*in_RDI->getCost)(local_18,iVar6 + in_RDI->dx0intersects_[local_a4],
                                       iVar1 + in_RDI->dy0intersects_[local_a4],in_RDI->downsample_)
            ;
            if (local_b0 <= bVar3) {
              in_stack_ffffffffffffff13 =
                   (*in_RDI->getCost)(local_18,iVar6 + in_RDI->dx0intersects_[local_a4],
                                      iVar1 + in_RDI->dy0intersects_[local_a4],in_RDI->downsample_);
              local_b0 = (uint)in_stack_ffffffffffffff13;
            }
            uVar8 = local_b0;
            in_stack_ffffffffffffff14 = local_b0;
            in_stack_ffffffffffffff12 =
                 (*in_RDI->getCost)(local_18,iVar6 + in_RDI->dx1intersects_[local_a4],
                                    iVar1 + in_RDI->dy1intersects_[local_a4],in_RDI->downsample_);
            if ((int)uVar8 <= (int)(uint)in_stack_ffffffffffffff12) {
              bVar3 = (*in_RDI->getCost)(local_18,iVar6 + in_RDI->dx1intersects_[local_a4],
                                         iVar1 + in_RDI->dy1intersects_[local_a4],
                                         in_RDI->downsample_);
              in_stack_ffffffffffffff04 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff04);
              local_b0 = (uint)bVar3;
            }
          }
          if (local_b0 < local_19) {
            iVar5 = (local_b0 + 1) * in_RDI->dxy_distance_mm_[local_a4];
            local_38 = in_RDI->searchStates2D_[x] + y;
            if (local_38->iterationaccessed != in_RDI->iteration_) {
              (local_38->super_AbstractSearchState).heapindex = -1;
            }
            if ((local_38->iterationaccessed != in_RDI->iteration_) ||
               (iVar5 + local_30->g < local_38->g)) {
              local_38->iterationaccessed = in_RDI->iteration_;
              if (iVar5 + local_30->g < 1000000000) {
                iVar5 = iVar5 + local_30->g;
              }
              else {
                iVar5 = 1000000000;
              }
              local_38->g = iVar5;
              if (999999999 < local_38->g) {
                uVar7 = __cxa_allocate_exception(0x10);
                SBPL_Exception::SBPL_Exception
                          ((SBPL_Exception *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffee8);
                __cxa_throw(uVar7,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
              }
              if ((local_38->super_AbstractSearchState).heapindex != -1) {
                CBucket::remove(&local_88,(char *)local_38);
              }
              CBucket::insert((CBucket *)CONCAT44(in_stack_ffffffffffffff04,iVar5),
                              (AbstractSearchState *)in_stack_fffffffffffffef8,
                              in_stack_fffffffffffffef4);
            }
          }
        }
      }
    }
    bVar2 = CBucket::empty(&local_88);
    if (bVar2) {
      in_RDI->largestcomputedoptf_ = 1000000000;
    }
    else {
      iVar6 = CBucket::getminpriority(&local_88);
      in_RDI->largestcomputedoptf_ = iVar6;
    }
  }
  local_1 = 0;
  CBucket::~CBucket((CBucket *)
                    CONCAT44(in_stack_ffffffffffffff14,
                             CONCAT13(in_stack_ffffffffffffff13,
                                      CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))
                            ));
  return (bool)(local_1 & 1);
}

Assistant:

bool SBPL2DGridSearch::search_withbuckets(unsigned char** Grid2D, unsigned char obsthresh, int startx_c, int starty_c,
                                          int goalx_c, int goaly_c)
{
    SBPL_2DGridSearchState *searchExpState = NULL;
    SBPL_2DGridSearchState *searchPredState = NULL;
    int numofExpands = 0;

    //get the current time
    clock_t starttime = clock();

    //int max_bucketed_priority = obsthresh*10*__max(this->width_, this->height_);
    int max_bucketed_priority = (int)(0.1 * obsthresh * dxy_distance_mm_[0] * __max(this->width_, this->height_));
    SBPL_PRINTF("bucket-based OPEN2D has up to %d bucketed priorities, the rest will be unsorted\n",
                max_bucketed_priority);
    CBucket OPEN2DBLIST(0, max_bucketed_priority);

    SBPL_PRINTF("OPEN2D allocation time=%d msecs\n", (int)(((clock() - starttime) / (double)CLOCKS_PER_SEC) * 1000));

    //closed = 0
    iteration_++;

    //init start and goal coordinates
    startX_ = startx_c;
    startY_ = starty_c;
    goalX_ = goalx_c;
    goalY_ = goaly_c;

    //check the validity of start/goal
    if (!withinMap(startx_c, starty_c) || !withinMap(goalx_c, goaly_c)) {
        SBPL_ERROR("ERROR: grid2Dsearch is called on invalid start (%d %d) or goal(%d %d)\n", startx_c, starty_c,
                   goalx_c, goaly_c);
        return false;
    }

    // initialize the start and goal states
    searchExpState = &searchStates2D_[startX_][startY_];
    initializeSearchState2D(searchExpState);
    //no initialization for the goal state - it will reset iteration_ variable

    //seed the search
    searchExpState->g = 0;
    searchExpState->heapindex = -1;
    OPEN2DBLIST.insert(searchExpState, searchExpState->g);

    //the main repetition of expansions
    while (!OPEN2DBLIST.empty()) {
        //get the next state for expansion
        searchExpState = (SBPL_2DGridSearchState*)OPEN2DBLIST.popminelement();
        numofExpands++;

        int exp_x = searchExpState->x;
        int exp_y = searchExpState->y;

        //iterate over successors
        for (int dir = 0; dir < SBPL_2DGRIDSEARCH_NUMOF2DDIRS; dir++) {
            int newx = exp_x + dx_[dir];
            int newy = exp_y + dy_[dir];

            //make sure it is inside the map and has no obstacle
            if (!withinMap(newx, newy)) continue;

            //compute the cost
            int mapcost = __max( getCost(Grid2D, newx, newy, downsample_), getCost(Grid2D, exp_x, exp_y, downsample_));

#if SBPL_2DGRIDSEARCH_NUMOF2DDIRS > 8
            if(dir > 7) {
                //check two more cells through which the action goes
                mapcost = __max(mapcost, getCost(Grid2D, exp_x + dx0intersects_[dir], exp_y + dy0intersects_[dir], downsample_));
                mapcost = __max(mapcost, getCost(Grid2D, exp_x + dx1intersects_[dir], exp_y + dy1intersects_[dir], downsample_));
            }
#endif

            if (mapcost >= obsthresh) //obstacle encountered
            continue;
            int cost = (mapcost + 1) * dxy_distance_mm_[dir];

            //get the predecessor
            searchPredState = &searchStates2D_[newx][newy];

            //clear the element from OPEN
            if (searchPredState->iterationaccessed != iteration_) searchPredState->heapindex = -1;

            //update predecessor if necessary
            if (searchPredState->iterationaccessed != iteration_ || searchPredState->g > cost + searchExpState->g) {
                int oldstatepriority = searchPredState->g;
                searchPredState->iterationaccessed = iteration_;
                searchPredState->g = __min(INFINITECOST, cost + searchExpState->g);

                if (searchPredState->g >= INFINITECOST) {
                    throw SBPL_Exception("ERROR: infinite g");
                }

                //put it into the list if not there already
                if (searchPredState->heapindex != -1) OPEN2DBLIST.remove(searchPredState, oldstatepriority);
                OPEN2DBLIST.insert(searchPredState, searchPredState->g);
            }
        } //over successors
    }//while

    //set lower bounds for the remaining states
    if (!OPEN2DBLIST.empty())
        largestcomputedoptf_ = OPEN2DBLIST.getminpriority();
    else
        largestcomputedoptf_ = INFINITECOST;

    SBPL_PRINTF( "# of expands during 2dgridsearch=%d time=%d msecs 2Dsolcost_inmm=%d "
                "largestoptfval=%d bucketassortedarraymaxsize=%d (start=%d %d goal=%d %d)\n",
                numofExpands, (int)(((clock() - starttime) / (double)CLOCKS_PER_SEC) * 1000),
                searchStates2D_[goalx_c][goaly_c].g, largestcomputedoptf_, OPEN2DBLIST.maxassortedpriorityVsize,
                startx_c, starty_c, goalx_c, goaly_c);

    return false;
}